

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O0

FT_ULong ft_gzip_get_uncompressed_size(FT_Stream stream)

{
  FT_ULong pos;
  FT_Error FVar1;
  FT_UInt32 FVar2;
  ulong local_28;
  FT_ULong result;
  FT_ULong old_pos;
  FT_Stream pFStack_10;
  FT_Error error;
  FT_Stream stream_local;
  
  local_28 = 0;
  pos = stream->pos;
  pFStack_10 = stream;
  FVar1 = FT_Stream_Seek(stream,stream->size - 4);
  if (FVar1 == 0) {
    FVar2 = FT_Stream_ReadULongLE(pFStack_10,(FT_Error *)((long)&old_pos + 4));
    local_28 = (ulong)FVar2;
    if (old_pos._4_4_ != 0) {
      local_28 = 0;
    }
    FT_Stream_Seek(pFStack_10,pos);
  }
  return local_28;
}

Assistant:

static FT_ULong
  ft_gzip_get_uncompressed_size( FT_Stream  stream )
  {
    FT_Error  error;
    FT_ULong  old_pos;
    FT_ULong  result = 0;


    old_pos = stream->pos;
    if ( !FT_Stream_Seek( stream, stream->size - 4 ) )
    {
      result = FT_Stream_ReadULongLE( stream, &error );
      if ( error )
        result = 0;

      (void)FT_Stream_Seek( stream, old_pos );
    }

    return result;
  }